

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportFileGenerator::PopulateInterfaceProperty
          (cmExportFileGenerator *this,string *propName,string *outputName,cmGeneratorTarget *target
          ,PreprocessContext preprocessRule,ImportPropertyMap *properties)

{
  cmValue input;
  mapped_type *pmVar1;
  string prepro;
  
  input = cmGeneratorTarget::GetProperty(target,propName);
  if (input.Value != (string *)0x0) {
    if ((input.Value)->_M_string_length == 0) {
      pmVar1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](properties,outputName);
      pmVar1->_M_string_length = 0;
      *(pmVar1->_M_dataplus)._M_p = '\0';
    }
    else {
      cmGeneratorExpression::Preprocess(&prepro,input.Value,preprocessRule,false);
      if (prepro._M_string_length != 0) {
        ResolveTargetsInGeneratorExpressions(this,&prepro,target,NoReplaceFreeTargets);
        pmVar1 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](properties,outputName);
        std::__cxx11::string::_M_assign((string *)pmVar1);
      }
      std::__cxx11::string::~string((string *)&prepro);
    }
  }
  return;
}

Assistant:

void cmExportFileGenerator::PopulateInterfaceProperty(
  const std::string& propName, const std::string& outputName,
  cmGeneratorTarget const* target,
  cmGeneratorExpression::PreprocessContext preprocessRule,
  ImportPropertyMap& properties)
{
  cmValue input = target->GetProperty(propName);
  if (input) {
    if (input->empty()) {
      // Set to empty
      properties[outputName].clear();
      return;
    }

    std::string prepro =
      cmGeneratorExpression::Preprocess(*input, preprocessRule);
    if (!prepro.empty()) {
      this->ResolveTargetsInGeneratorExpressions(prepro, target);
      properties[outputName] = prepro;
    }
  }
}